

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_handshake_record
              (ptls_t *tls,
              _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
              *cb,ptls_message_emitter_t *emitter,st_ptls_record_t *rec,
              ptls_handshake_properties_t *properties)

{
  uint32_t uVar1;
  int iVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_58;
  uint8_t *src_end;
  uint8_t *src;
  size_t mess_len;
  int ret;
  ptls_handshake_properties_t *properties_local;
  st_ptls_record_t *rec_local;
  ptls_message_emitter_t *emitter_local;
  _func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
  *cb_local;
  ptls_t *tls_local;
  
  src = (uint8_t *)0x0;
  if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
    if (rec->type == '\x16') {
      if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
        src_end = rec->fragment;
        local_58 = src_end + rec->length;
      }
      else {
        iVar2 = ptls_buffer_reserve(&(tls->recvbuf).mess,rec->length);
        if (iVar2 != 0) {
          return iVar2;
        }
        memcpy((tls->recvbuf).mess.base + (tls->recvbuf).mess.off,rec->fragment,rec->length);
        (tls->recvbuf).mess.off = rec->length + (tls->recvbuf).mess.off;
        src_end = (tls->recvbuf).mess.base;
        local_58 = src_end + (tls->recvbuf).mess.off;
      }
      mess_len._4_4_ = 0x202;
      goto LAB_0011a199;
    }
    tls_local._4_4_ = 0x32;
  }
  else {
    msg("Reenter handle_handshake_record");
    src_end = (tls->recvbuf).mess.base;
    local_58 = src_end + (tls->recvbuf).mess.off;
    do {
      msg("Calling cb");
      pVar3 = ptls_iovec_init(src_end,(size_t)src);
      mess_len._4_4_ = (*cb)(tls,emitter,pVar3,(uint)(local_58 + -(long)src_end == src),properties);
      if ((mess_len._4_4_ != 0) && (mess_len._4_4_ != 0x202)) {
        ptls_buffer_dispose(&(tls->recvbuf).mess);
        return mess_len._4_4_;
      }
      msg("Finished cb, ret: %d, in_handshake: %d",(ulong)mess_len._4_4_,
          (ulong)((byte)tls->field_0x160 >> 5 & 1));
      if (((byte)tls->field_0x160 >> 5 & 1) != 0) {
        return 0x202;
      }
      src_end = src + (long)src_end;
LAB_0011a199:
      if ((long)local_58 - (long)src_end < 4) break;
      uVar1 = ntoh24(src_end + 1);
      src = (uint8_t *)(ulong)(uVar1 + 4);
    } while ((long)(int)(uVar1 + 4) <= (long)local_58 - (long)src_end);
    if (src_end == local_58) {
      ptls_buffer_dispose(&(tls->recvbuf).mess);
    }
    else {
      msg("Preserving partial message");
      if ((tls->recvbuf).mess.base == (uint8_t *)0x0) {
        ptls_buffer_init(&(tls->recvbuf).mess,"",0);
        iVar2 = ptls_buffer_reserve(&(tls->recvbuf).mess,(long)local_58 - (long)src_end);
        if (iVar2 != 0) {
          return iVar2;
        }
        memcpy((tls->recvbuf).mess.base,src_end,(long)local_58 - (long)src_end);
      }
      else {
        memmove((tls->recvbuf).mess.base,src_end,(long)local_58 - (long)src_end);
      }
      (tls->recvbuf).mess.off = (long)local_58 - (long)src_end;
      mess_len._4_4_ = 0x202;
    }
    tls_local._4_4_ = mess_len._4_4_;
  }
  return tls_local._4_4_;
}

Assistant:

static int handle_handshake_record(ptls_t *tls,
                                   int (*cb)(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                                             int is_end_of_record, ptls_handshake_properties_t *properties),
                                   ptls_message_emitter_t *emitter, struct st_ptls_record_t *rec,
                                   ptls_handshake_properties_t *properties)
{
    int ret;
    size_t mess_len = 0;
    const uint8_t *src, *src_end;
    if (tls->in_handshake)
    {
        msg("Reenter handle_handshake_record");
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
        goto resume_handshake;
    }
    /* handshake */
    if (rec->type != PTLS_CONTENT_TYPE_HANDSHAKE)
        return PTLS_ALERT_DECODE_ERROR;

    /* flatten the unhandled messages */
    if (tls->recvbuf.mess.base == NULL) {
        src = rec->fragment;
        src_end = src + rec->length;
    } else {
        if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, rec->length)) != 0)
            return ret;
        memcpy(tls->recvbuf.mess.base + tls->recvbuf.mess.off, rec->fragment, rec->length);
        tls->recvbuf.mess.off += rec->length;
        src = tls->recvbuf.mess.base;
        src_end = src + tls->recvbuf.mess.off;
    }

    /* handle the messages */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (src_end - src >= 4) {
        mess_len = 4 + ntoh24(src + 1);
        if (src_end - src < (int)mess_len)
            break;
resume_handshake:
        msg("Calling cb");
        ret = cb(tls, emitter, ptls_iovec_init(src, mess_len), src_end - src == mess_len, properties);
        switch (ret) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            msg("Finished cb, ret: %d, in_handshake: %d", ret, tls->in_handshake);
            if (tls->in_handshake)
                return PTLS_ERROR_IN_PROGRESS;
            break;
        default:
            ptls_buffer_dispose(&tls->recvbuf.mess);
            return ret;
        }
        src += mess_len;
    }

    /* keep last partial message in buffer */
    if (src != src_end) {
        msg("Preserving partial message");
        if (tls->recvbuf.mess.base == NULL) {
            ptls_buffer_init(&tls->recvbuf.mess, "", 0);
            if ((ret = ptls_buffer_reserve(&tls->recvbuf.mess, src_end - src)) != 0)
                return ret;
            memcpy(tls->recvbuf.mess.base, src, src_end - src);
        } else {
            memmove(tls->recvbuf.mess.base, src, src_end - src);
        }
        tls->recvbuf.mess.off = src_end - src;
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ptls_buffer_dispose(&tls->recvbuf.mess);
    }

    return ret;
}